

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationRuleParser::parseString
          (CollationRuleParser *this,int32_t i,UnicodeString *raw,UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t cVar2;
  char16_t cVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 in_register_00000034;
  char *__filename;
  int local_38;
  UChar32 c_1;
  int32_t j;
  UChar32 c;
  UErrorCode *errorCode_local;
  UnicodeString *raw_local;
  int32_t i_local;
  CollationRuleParser *this_local;
  
  __filename = (char *)CONCAT44(in_register_00000034,i);
  UVar1 = ::U_FAILURE(*errorCode);
  this_local._4_4_ = i;
  if (UVar1 == '\0') {
    icu_63::UnicodeString::remove(raw,__filename);
    iVar5 = i;
LAB_0026a4a2:
    raw_local._4_4_ = iVar5;
    iVar4 = icu_63::UnicodeString::length(this->rules);
    if (raw_local._4_4_ < iVar4) {
      iVar5 = raw_local._4_4_ + 1;
      cVar2 = icu_63::UnicodeString::charAt(this->rules,raw_local._4_4_);
      uVar6 = (uint)(ushort)cVar2;
      UVar1 = isSyntaxChar(uVar6);
      if (UVar1 == '\0') {
        UVar1 = PatternProps::isWhiteSpace(uVar6);
        if (UVar1 != '\0') goto LAB_0026a6c1;
        icu_63::UnicodeString::append(raw,cVar2);
      }
      else if (uVar6 == 0x27) {
        iVar4 = icu_63::UnicodeString::length(this->rules);
        if ((iVar4 <= iVar5) ||
           (cVar2 = icu_63::UnicodeString::charAt(this->rules,iVar5), cVar2 != L'\'')) {
          do {
            raw_local._4_4_ = iVar5;
            iVar4 = icu_63::UnicodeString::length(this->rules);
            if (raw_local._4_4_ == iVar4) {
              setParseError(this,"quoted literal text missing terminating apostrophe",errorCode);
              return raw_local._4_4_;
            }
            iVar5 = raw_local._4_4_ + 1;
            cVar2 = icu_63::UnicodeString::charAt(this->rules,raw_local._4_4_);
            if (cVar2 == L'\'') {
              iVar4 = icu_63::UnicodeString::length(this->rules);
              if ((iVar4 <= iVar5) ||
                 (cVar3 = icu_63::UnicodeString::charAt(this->rules,iVar5), cVar3 != L'\''))
              goto LAB_0026a4a2;
              iVar5 = raw_local._4_4_ + 2;
            }
            raw_local._4_4_ = iVar5;
            icu_63::UnicodeString::append(raw,cVar2);
            iVar5 = raw_local._4_4_;
          } while( true );
        }
        icu_63::UnicodeString::append(raw,L'\'');
        iVar5 = raw_local._4_4_ + 2;
      }
      else {
        if (uVar6 != 0x5c) goto LAB_0026a6c1;
        iVar4 = icu_63::UnicodeString::length(this->rules);
        if (iVar5 == iVar4) {
          setParseError(this,"backslash escape at the end of the rule string",errorCode);
          return iVar5;
        }
        uVar6 = icu_63::UnicodeString::char32At(this->rules,iVar5);
        icu_63::UnicodeString::append(raw,uVar6);
        iVar7 = 2;
        if (uVar6 < 0x10000) {
          iVar7 = 1;
        }
        iVar5 = iVar7 + iVar5;
      }
      goto LAB_0026a4a2;
    }
LAB_0026a6c1:
    for (local_38 = 0; iVar4 = icu_63::UnicodeString::length(raw), local_38 < iVar4;
        local_38 = iVar5 + local_38) {
      uVar6 = icu_63::UnicodeString::char32At(raw,local_38);
      if ((uVar6 & 0xfffff800) == 0xd800) {
        setParseError(this,"string contains an unpaired surrogate",errorCode);
        return raw_local._4_4_;
      }
      if ((0xfffc < (int)uVar6) && ((int)uVar6 < 0x10000)) {
        setParseError(this,"string contains U+FFFD, U+FFFE or U+FFFF",errorCode);
        return raw_local._4_4_;
      }
      iVar5 = 2;
      if (uVar6 < 0x10000) {
        iVar5 = 1;
      }
    }
    this_local._4_4_ = raw_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationRuleParser::parseString(int32_t i, UnicodeString &raw, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return i; }
    raw.remove();
    while(i < rules->length()) {
        UChar32 c = rules->charAt(i++);
        if(isSyntaxChar(c)) {
            if(c == 0x27) {  // apostrophe
                if(i < rules->length() && rules->charAt(i) == 0x27) {
                    // Double apostrophe, encodes a single one.
                    raw.append((UChar)0x27);
                    ++i;
                    continue;
                }
                // Quote literal text until the next single apostrophe.
                for(;;) {
                    if(i == rules->length()) {
                        setParseError("quoted literal text missing terminating apostrophe", errorCode);
                        return i;
                    }
                    c = rules->charAt(i++);
                    if(c == 0x27) {
                        if(i < rules->length() && rules->charAt(i) == 0x27) {
                            // Double apostrophe inside quoted literal text,
                            // still encodes a single apostrophe.
                            ++i;
                        } else {
                            break;
                        }
                    }
                    raw.append((UChar)c);
                }
            } else if(c == 0x5c) {  // backslash
                if(i == rules->length()) {
                    setParseError("backslash escape at the end of the rule string", errorCode);
                    return i;
                }
                c = rules->char32At(i);
                raw.append(c);
                i += U16_LENGTH(c);
            } else {
                // Any other syntax character terminates a string.
                --i;
                break;
            }
        } else if(PatternProps::isWhiteSpace(c)) {
            // Unquoted white space terminates a string.
            --i;
            break;
        } else {
            raw.append((UChar)c);
        }
    }
    for(int32_t j = 0; j < raw.length();) {
        UChar32 c = raw.char32At(j);
        if(U_IS_SURROGATE(c)) {
            setParseError("string contains an unpaired surrogate", errorCode);
            return i;
        }
        if(0xfffd <= c && c <= 0xffff) {
            setParseError("string contains U+FFFD, U+FFFE or U+FFFF", errorCode);
            return i;
        }
        j += U16_LENGTH(c);
    }
    return i;
}